

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icosahedralBuilderCmd.cpp
# Opt level: O0

void cmdline_parser_release(gengetopt_args_info *args_info)

{
  gengetopt_args_info *in_RDI;
  uint i;
  uint local_c;
  
  free_string_field((char **)0x11e6e7);
  free_string_field((char **)0x11e6f5);
  free_string_field((char **)0x11e703);
  free_string_field((char **)0x11e711);
  free_string_field((char **)0x11e71f);
  free_string_field((char **)0x11e72d);
  free_string_field((char **)0x11e73b);
  free_string_field((char **)0x11e74c);
  free_string_field((char **)0x11e75d);
  free_string_field((char **)0x11e76e);
  for (local_c = 0; local_c < in_RDI->inputs_num; local_c = local_c + 1) {
    free(in_RDI->inputs[local_c]);
  }
  if (in_RDI->inputs_num != 0) {
    free(in_RDI->inputs);
  }
  clear_given(in_RDI);
  return;
}

Assistant:

static void
cmdline_parser_release (struct gengetopt_args_info *args_info)
{
  unsigned int i;
  free_string_field (&(args_info->output_arg));
  free_string_field (&(args_info->output_orig));
  free_string_field (&(args_info->shells_orig));
  free_string_field (&(args_info->latticeConstant_orig));
  free_string_field (&(args_info->lattice_arg));
  free_string_field (&(args_info->lattice_orig));
  free_string_field (&(args_info->columnAtoms_orig));
  free_string_field (&(args_info->twinAtoms_orig));
  free_string_field (&(args_info->truncatedPlanes_orig));
  free_string_field (&(args_info->unitCells_orig));
  
  
  for (i = 0; i < args_info->inputs_num; ++i)
    free (args_info->inputs [i]);

  if (args_info->inputs_num)
    free (args_info->inputs);

  clear_given (args_info);
}